

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_attribute.cpp
# Opt level: O2

adios2_error adios2_attribute_name(char *name,size_t *size,adios2_attribute *attribute)

{
  allocator local_60 [32];
  string local_40;
  
  std::__cxx11::string::string
            ((string *)&local_40,"for attribute, in call to adios2_attribute_name",local_60);
  adios2::helper::CheckForNullptr<adios2_attribute_const>(attribute,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  anon_unknown.dwarf_3ecbe::String2CAPI((string *)(attribute + 8),name,size);
  return adios2_error_none;
}

Assistant:

adios2_error adios2_attribute_name(char *name, size_t *size, const adios2_attribute *attribute)
{
    try
    {
        adios2::helper::CheckForNullptr(attribute,
                                        "for attribute, in call to adios2_attribute_name");

        const adios2::core::AttributeBase *attributeBase =
            reinterpret_cast<const adios2::core::AttributeBase *>(attribute);

        return String2CAPI(attributeBase->m_Name, name, size);
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_attribute_name"));
    }
}